

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_buffer_free(nk_buffer *b)

{
  nk_buffer *b_local;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1a4b,"void nk_buffer_free(struct nk_buffer *)");
  }
  if ((((b != (nk_buffer *)0x0) && ((b->memory).ptr != (void *)0x0)) && (b->type != NK_BUFFER_FIXED)
      ) && ((b->pool).free != (nk_plugin_free)0x0)) {
    if ((b->pool).free == (nk_plugin_free)0x0) {
      __assert_fail("b->pool.free",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x1a4f,"void nk_buffer_free(struct nk_buffer *)");
    }
    (*(b->pool).free)((b->pool).userdata,(b->memory).ptr);
  }
  return;
}

Assistant:

NK_API void
nk_buffer_free(struct nk_buffer *b)
{
    NK_ASSERT(b);
    if (!b || !b->memory.ptr) return;
    if (b->type == NK_BUFFER_FIXED) return;
    if (!b->pool.free) return;
    NK_ASSERT(b->pool.free);
    b->pool.free(b->pool.userdata, b->memory.ptr);
}